

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

void fmt::v7::print<char[109],unsigned_int&,unsigned_int&,float&,float&,char>
               (FILE *f,char (*format_str) [109],uint *args,uint *args_1,float *args_2,float *args_3
               )

{
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_unsigned_int,_unsigned_int,_float,_float>
  *vargs;
  FILE *in_stack_00000190;
  undefined1 in_stack_00000198 [16];
  undefined1 in_stack_000001a8 [16];
  remove_reference_t<float_&> *in_stack_ffffffffffffff28;
  remove_reference_t<float_&> *in_stack_ffffffffffffff30;
  remove_reference_t<unsigned_int_&> *in_stack_ffffffffffffff38;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_stack_ffffffffffffff40;
  char (*in_stack_ffffffffffffff48) [109];
  value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> local_a8 [4];
  value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *local_60;
  value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *local_28;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_20;
  value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *local_18;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_10;
  value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *local_8;
  
  make_args_checked<unsigned_int&,unsigned_int&,float&,float&,char[109],char>
            (in_stack_ffffffffffffff48,
             (remove_reference_t<unsigned_int_&> *)in_stack_ffffffffffffff40.values_,
             in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  local_60 = local_a8;
  to_string_view<char,_0>((char *)0x112c4d);
  local_20 = (basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
              *)&stack0xffffffffffffff38;
  local_28 = local_60;
  local_18 = local_60;
  local_8 = local_60;
  local_10 = local_20;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>::
  basic_format_args(local_20,0x9922,local_60);
  vprint(in_stack_00000190,(string_view)in_stack_000001a8,(format_args)in_stack_00000198);
  return;
}

Assistant:

inline void print(std::FILE* f, const S& format_str, Args&&... args) {
  const auto& vargs = fmt::make_args_checked<Args...>(format_str, args...);
  return detail::is_unicode<Char>()
             ? vprint(f, to_string_view(format_str), vargs)
             : detail::vprint_mojibake(f, to_string_view(format_str), vargs);
}